

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall Stack1_advanced_Except_Test::TestBody(Stack1_advanced_Except_Test *this)

{
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_58;
  AssertionResult gtest_ar_;
  AssertHelper local_40;
  string local_38;
  SimpleStack<int> s;
  
  s.top = (Node *)0x0;
  SimpleStack<int>::head(&s);
  gtest_ar_.success_ = false;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::Message::Message((Message *)&sStack_58);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_38,(internal *)&gtest_ar_,(AssertionResult *)"flag","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
             ,0x4b,local_38._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&sStack_58);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  SimpleStack<int>::~SimpleStack(&s);
  return;
}

Assistant:

TEST(Stack1_advanced, Except) {
	bool flag = false;
	SimpleStack<int> s;
	try {
		s.head();
	}
	catch (std::exception &e) {
		EXPECT_EQ(std::string(e.what()), "The stack is empty!");
		flag = true;
	}
	EXPECT_TRUE(flag);
}